

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v10::detail::do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                 (char *begin,char *end,dynamic_spec_id_handler<char> *handler)

{
  dynamic_spec_id_handler<char> *this;
  char *s;
  bool bVar1;
  bool bVar2;
  type count;
  basic_string_view<char> local_50;
  dynamic_spec_id_handler<char> *local_40;
  char *it;
  int local_30;
  int max;
  int index;
  char c;
  dynamic_spec_id_handler<char> *handler_local;
  char *end_local;
  char *begin_local;
  
  max._3_1_ = *begin;
  _index = handler;
  handler_local = (dynamic_spec_id_handler<char> *)end;
  end_local = begin;
  if ((max._3_1_ < '0') || ('9' < max._3_1_)) {
    bVar1 = is_name_start<char>(max._3_1_);
    if (!bVar1) {
      throw_format_error("invalid format string");
    }
    local_40 = (dynamic_spec_id_handler<char> *)end_local;
    do {
      local_40 = (dynamic_spec_id_handler<char> *)((long)&local_40->ctx + 1);
      bVar1 = false;
      if (local_40 != handler_local) {
        bVar2 = is_name_start<char>(*(char *)&local_40->ctx);
        bVar1 = true;
        if ((!bVar2) && (bVar1 = false, '/' < *(char *)&local_40->ctx)) {
          bVar1 = *(char *)&local_40->ctx < ':';
        }
      }
      s = end_local;
      this = _index;
    } while (bVar1);
    count = to_unsigned<long>((long)local_40 - (long)end_local);
    basic_string_view<char>::basic_string_view(&local_50,s,count);
    dynamic_spec_id_handler<char>::on_name(this,local_50);
    begin_local = (char *)local_40;
  }
  else {
    local_30 = 0;
    it._4_4_ = 0x7fffffff;
    if (max._3_1_ == '0') {
      end_local = begin + 1;
    }
    else {
      local_30 = parse_nonnegative_int<char>(&end_local,end,0x7fffffff);
    }
    if (((dynamic_spec_id_handler<char> *)end_local == handler_local) ||
       ((*end_local != '}' && (*end_local != ':')))) {
      throw_format_error("invalid format string");
    }
    dynamic_spec_id_handler<char>::on_index(_index,local_30);
    begin_local = end_local;
  }
  return begin_local;
}

Assistant:

FMT_CONSTEXPR auto do_parse_arg_id(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  Char c = *begin;
  if (c >= '0' && c <= '9') {
    int index = 0;
    constexpr int max = (std::numeric_limits<int>::max)();
    if (c != '0')
      index = parse_nonnegative_int(begin, end, max);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      throw_format_error("invalid format string");
    else
      handler.on_index(index);
    return begin;
  }
  if (!is_name_start(c)) {
    throw_format_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(*it) || ('0' <= *it && *it <= '9')));
  handler.on_name({begin, to_unsigned(it - begin)});
  return it;
}